

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# z-util.c
# Opt level: O0

wchar_t hex_str_to_int(char *s)

{
  wchar_t wVar1;
  wchar_t local_1c;
  wchar_t current;
  wchar_t result;
  char *s_local;
  
  local_1c = L'\0';
  _current = s;
  while( true ) {
    if (*_current == '\0') {
      return local_1c;
    }
    wVar1 = hex_char_to_int(*_current);
    if (wVar1 == L'\xffffffff') break;
    local_1c = wVar1 + local_1c * 0x10;
    _current = _current + 1;
  }
  return L'\xffffffff';
}

Assistant:

int hex_str_to_int(const char *s) {
	int result = 0;
	while (*s) {
		int current = hex_char_to_int(*s);
		if (current == -1)
			return -1;
		result *= 16;
		result += current;
		++s;
	}
	return result;
}